

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O2

bool __thiscall Uniforms::feedTo(Uniforms *this,Shader *_shader,bool _lights,bool _buffers)

{
  Texture *_tex;
  size_t sVar1;
  UniformDataMap *pUVar2;
  Uniforms *pUVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  GLuint _textureId;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  long lVar9;
  ulong uVar10;
  Fbo *pFVar11;
  vec3 *pvVar12;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  ulong uVar13;
  Uniforms *pUVar14;
  uint uVar15;
  byte bVar16;
  iterator it;
  float fVar17;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  uint local_98;
  undefined4 local_94;
  Uniforms *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  ulong local_68;
  undefined4 local_5c;
  _Rb_tree_node_base *local_58;
  string local_50;
  
  local_5c = (undefined4)CONCAT71(in_register_00000009,_buffers);
  local_94 = (undefined4)CONCAT71(in_register_00000011,_lights);
  p_Var7 = (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90 = this;
  do {
    pUVar3 = local_90;
    if ((_Rb_tree_header *)p_Var7 == &(this->functions)._M_t._M_impl.super__Rb_tree_header) {
      pUVar2 = &local_90->data;
      uVar15 = 0;
      for (p_Var8 = (local_90->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &(pUVar2->_M_t)._M_impl.super__Rb_tree_header;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        vera::Shader::setUniform
                  (_shader,(string *)(p_Var8 + 1),(float *)&p_Var8[4]._M_left,
                   *(size_t *)(p_Var8 + 5));
        uVar15 = (uint)(byte)((byte)uVar15 | *(byte *)((long)&p_Var8[5]._M_parent + 1));
      }
      p_Var8 = (pUVar3->sequences)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_98 = uVar15;
      while ((_Rb_tree_header *)p_Var8 != &(pUVar3->sequences)._M_t._M_impl.super__Rb_tree_header) {
        lVar9 = (long)p_Var8[2]._M_parent - *(long *)(p_Var8 + 2);
        if (lVar9 != 0) {
          lVar9 = *(long *)(p_Var8 + 2) + (pUVar3->m_frame % (ulong)(lVar9 / 0x70)) * 0x70;
          vera::Shader::setUniform
                    (_shader,(string *)(p_Var8 + 1),(float *)(lVar9 + 0x50),
                     *(size_t *)(lVar9 + 0x60));
          local_98 = 1;
        }
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      }
      p_Var7 = (pUVar3->super_Scene).textures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pUVar14 = pUVar3;
      while ((_Rb_tree_header *)p_Var7 !=
             &(pUVar3->super_Scene).textures._M_t._M_impl.super__Rb_tree_header) {
        _tex = *(Texture **)(p_Var7 + 2);
        sVar1 = _shader->textureIndex;
        _shader->textureIndex = sVar1 + 1;
        vera::Shader::setUniformTexture(_shader,(string *)(p_Var7 + 1),_tex,sVar1);
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var7 + 1),"Resolution");
        iVar5 = (**(code **)(**(long **)(p_Var7 + 2) + 0x60))();
        iVar6 = (**(code **)(**(long **)(p_Var7 + 2) + 0x68))();
        vera::Shader::setUniform(_shader,&name,(float)iVar5,(float)iVar6);
        std::__cxx11::string::~string((string *)&name);
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        pUVar14 = local_90;
      }
      local_58 = &(pUVar14->super_Scene).streams._M_t._M_impl.super__Rb_tree_header._M_header;
      for (p_Var7 = (pUVar14->super_Scene).streams._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left; pUVar3 = local_90, p_Var7 != local_58;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        p_Var8 = p_Var7 + 1;
        uVar13 = 0;
        while( true ) {
          local_68 = uVar13;
          uVar10 = (**(code **)(**(long **)(p_Var7 + 2) + 0xa0))();
          if (uVar10 <= uVar13) break;
          std::operator+(&local_88,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var8
                         ,"Prev[");
          vera::toString<unsigned_long>(&local_50,&local_68);
          std::operator+(&local_b8,&local_88,&local_50);
          std::operator+(&name,&local_b8,"]");
          _textureId = (**(code **)(**(long **)(p_Var7 + 2) + 0xa8))
                                 (*(long **)(p_Var7 + 2),local_68);
          sVar1 = _shader->textureIndex;
          _shader->textureIndex = sVar1 + 1;
          vera::Shader::setUniformTexture(_shader,&name,_textureId,sVar1);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_88);
          uVar13 = local_68 + 1;
        }
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var8,"Time");
        fVar17 = (float)(**(code **)(**(long **)(p_Var7 + 2) + 0xd0))();
        vera::Shader::setUniform(_shader,&name,fVar17);
        std::__cxx11::string::~string((string *)&name);
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var8,"Fps");
        fVar17 = (float)(**(code **)(**(long **)(p_Var7 + 2) + 0xc0))();
        vera::Shader::setUniform(_shader,&name,fVar17);
        std::__cxx11::string::~string((string *)&name);
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var8,"Duration");
        fVar17 = (float)(**(code **)(**(long **)(p_Var7 + 2) + 200))();
        vera::Shader::setUniform(_shader,&name,fVar17);
        std::__cxx11::string::~string((string *)&name);
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var8,"CurrentFrame");
        fVar17 = (float)(**(code **)(**(long **)(p_Var7 + 2) + 0xe8))();
        vera::Shader::setUniform(_shader,&name,fVar17);
        std::__cxx11::string::~string((string *)&name);
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var8,"TotalFrames");
        fVar17 = (float)(**(code **)(**(long **)(p_Var7 + 2) + 0xe0))();
        vera::Shader::setUniform(_shader,&name,fVar17);
        std::__cxx11::string::~string((string *)&name);
      }
      if ((char)local_5c != '\0') {
        for (local_88._M_dataplus._M_p = (pointer)0x0;
            local_88._M_dataplus._M_p <
            (pointer)((long)(pUVar3->buffers).
                            super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(pUVar3->buffers).
                            super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3);
            local_88._M_dataplus._M_p = local_88._M_dataplus._M_p + 1) {
          vera::toString<unsigned_long>(&local_b8,(unsigned_long *)&local_88);
          std::operator+(&name,"u_buffer",&local_b8);
          pFVar11 = (pUVar3->buffers).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[(long)local_88._M_dataplus._M_p];
          sVar1 = _shader->textureIndex;
          _shader->textureIndex = sVar1 + 1;
          vera::Shader::setUniformTexture(_shader,&name,pFVar11,sVar1);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::~string((string *)&local_b8);
        }
        for (local_88._M_dataplus._M_p = (pointer)0x0;
            local_88._M_dataplus._M_p <
            (pointer)((long)(pUVar3->doubleBuffers).
                            super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pUVar3->doubleBuffers).
                            super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
            local_88._M_dataplus._M_p = local_88._M_dataplus._M_p + 1) {
          vera::toString<unsigned_long>(&local_b8,(unsigned_long *)&local_88);
          std::operator+(&name,"u_doubleBuffer",&local_b8);
          pFVar11 = (pUVar3->doubleBuffers).
                    super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)local_88._M_dataplus._M_p]->src;
          sVar1 = _shader->textureIndex;
          _shader->textureIndex = sVar1 + 1;
          vera::Shader::setUniformTexture(_shader,&name,pFVar11,sVar1);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::~string((string *)&local_b8);
        }
        for (local_88._M_dataplus._M_p = (pointer)0x0;
            local_88._M_dataplus._M_p <
            (pointer)(((long)(pUVar3->floods).
                             super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pUVar3->floods).
                            super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0xc0);
            local_88._M_dataplus._M_p = local_88._M_dataplus._M_p + 1) {
          vera::toString<unsigned_long>(&local_b8,(unsigned_long *)&local_88);
          std::operator+(&name,"u_flood",&local_b8);
          pFVar11 = (pUVar3->floods).super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>.
                    _M_impl.super__Vector_impl_data._M_start[(long)local_88._M_dataplus._M_p].
                    super_PingPong.dst;
          sVar1 = _shader->textureIndex;
          _shader->textureIndex = sVar1 + 1;
          vera::Shader::setUniformTexture(_shader,&name,pFVar11,sVar1);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::~string((string *)&local_b8);
        }
      }
      for (local_88._M_dataplus._M_p = (pointer)0x0;
          local_88._M_dataplus._M_p <
          (pointer)(((long)(pUVar3->pyramids).
                           super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(pUVar3->pyramids).
                          super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x580);
          local_88._M_dataplus._M_p = local_88._M_dataplus._M_p + 1) {
        vera::toString<unsigned_long>(&local_b8,(unsigned_long *)&local_88);
        std::operator+(&name,"u_pyramid",&local_b8);
        pFVar11 = vera::Pyramid::getResult
                            ((pUVar3->pyramids).
                             super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>.
                             _M_impl.super__Vector_impl_data._M_start +
                             (long)local_88._M_dataplus._M_p,0);
        sVar1 = _shader->textureIndex;
        _shader->textureIndex = sVar1 + 1;
        vera::Shader::setUniformTexture(_shader,&name,pFVar11,sVar1);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::~string((string *)&local_b8);
      }
      bVar16 = (byte)local_98;
      if ((char)local_94 != '\0') {
        p_Var7 = (pUVar3->super_Scene).lights._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((pUVar3->super_Scene).lights._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
          std::__cxx11::string::string((string *)&name,"u_lightColor",(allocator *)&local_b8);
          vera::Shader::setUniform(_shader,&name,(vec3 *)(*(long *)(p_Var7 + 2) + 0xb0));
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::string((string *)&name,"u_lightIntensity",(allocator *)&local_b8);
          vera::Shader::setUniform(_shader,&name,*(float *)(*(long *)(p_Var7 + 2) + 200));
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::string((string *)&name,"u_light",(allocator *)&local_b8);
          pvVar12 = (vec3 *)(**(code **)(**(long **)(p_Var7 + 2) + 0x98))();
          vera::Shader::setUniform(_shader,&name,pvVar12);
          std::__cxx11::string::~string((string *)&name);
          lVar9 = *(long *)(p_Var7 + 2);
          if ((*(uint *)(lVar9 + 0x210) & 0xfffffffd) == 0) {
            std::__cxx11::string::string((string *)&name,"u_lightDirection",(allocator *)&local_b8);
            vera::Shader::setUniform(_shader,&name,(vec3 *)(*(long *)(p_Var7 + 2) + 0xbc));
            std::__cxx11::string::~string((string *)&name);
            lVar9 = *(long *)(p_Var7 + 2);
          }
          if (0.0 < *(float *)(lVar9 + 0xcc)) {
            std::__cxx11::string::string((string *)&name,"u_lightFalloff",(allocator *)&local_b8);
            vera::Shader::setUniform(_shader,&name,*(float *)(*(long *)(p_Var7 + 2) + 0xcc));
            std::__cxx11::string::~string((string *)&name);
          }
          std::__cxx11::string::string((string *)&name,"u_lightMatrix",(allocator *)&local_b8);
          vera::Shader::setUniform(_shader,&name,(mat4 *)(*(long *)(p_Var7 + 2) + 0x1c8),false);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::string((string *)&name,"u_lightShadowMap",(allocator *)&local_b8);
          lVar9 = *(long *)(p_Var7 + 2);
          sVar1 = _shader->textureIndex;
          _shader->textureIndex = sVar1 + 1;
          vera::Shader::setUniformDepthTexture(_shader,&name,(Fbo *)(lVar9 + 0xd0),sVar1);
          std::__cxx11::string::~string((string *)&name);
        }
        else {
          for (; (_Rb_tree_header *)p_Var7 !=
                 &(pUVar3->super_Scene).lights._M_t._M_impl.super__Rb_tree_header;
              p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
            std::operator+(&name,"u_",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var7 + 1));
            std::operator+(&local_b8,&name,"Color");
            vera::Shader::setUniform(_shader,&local_b8,(vec3 *)(*(long *)(p_Var7 + 2) + 0xb0));
            std::__cxx11::string::~string((string *)&local_b8);
            std::operator+(&local_b8,&name,"Intensity");
            vera::Shader::setUniform(_shader,&local_b8,*(float *)(*(long *)(p_Var7 + 2) + 200));
            std::__cxx11::string::~string((string *)&local_b8);
            pvVar12 = (vec3 *)(**(code **)(**(long **)(p_Var7 + 2) + 0x98))();
            vera::Shader::setUniform(_shader,&name,pvVar12);
            lVar9 = *(long *)(p_Var7 + 2);
            if ((*(uint *)(lVar9 + 0x210) & 0xfffffffd) == 0) {
              std::operator+(&local_b8,&name,"Direction");
              vera::Shader::setUniform(_shader,&local_b8,(vec3 *)(*(long *)(p_Var7 + 2) + 0xbc));
              std::__cxx11::string::~string((string *)&local_b8);
              lVar9 = *(long *)(p_Var7 + 2);
            }
            if (0.0 < *(float *)(lVar9 + 0xcc)) {
              std::operator+(&local_b8,&name,"Falloff");
              vera::Shader::setUniform(_shader,&local_b8,*(float *)(*(long *)(p_Var7 + 2) + 0xcc));
              std::__cxx11::string::~string((string *)&local_b8);
            }
            std::operator+(&local_b8,&name,"Matrix");
            vera::Shader::setUniform
                      (_shader,&local_b8,(mat4 *)(*(long *)(p_Var7 + 2) + 0x1c8),false);
            std::__cxx11::string::~string((string *)&local_b8);
            std::operator+(&local_b8,&name,"ShadowMap");
            lVar9 = *(long *)(p_Var7 + 2);
            sVar1 = _shader->textureIndex;
            _shader->textureIndex = sVar1 + 1;
            vera::Shader::setUniformDepthTexture(_shader,&local_b8,(Fbo *)(lVar9 + 0xd0),sVar1);
            std::__cxx11::string::~string((string *)&local_b8);
            std::__cxx11::string::~string((string *)&name);
          }
        }
        pUVar3 = local_90;
        bVar16 = (byte)local_98;
        if ((local_90->super_Scene).activeCubemap != (TextureCube *)0x0) {
          std::__cxx11::string::string((string *)&name,"u_cubeMap",(allocator *)&local_b8);
          vera::Shader::setUniformTextureCube(_shader,&name,(pUVar3->super_Scene).activeCubemap);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::string((string *)&name,"u_SH",(allocator *)&local_b8);
          vera::Shader::setUniform(_shader,&name,((pUVar3->super_Scene).activeCubemap)->SH,9);
          std::__cxx11::string::~string((string *)&name);
        }
      }
      return (bool)(bVar16 & 1);
    }
    if ((char)local_94 == '\0') {
      p_Var8 = p_Var7 + 1;
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              p_Var8,"u_scene");
      if (!bVar4) {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )p_Var8,"u_sceneDepth");
        if (!bVar4) {
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)p_Var8,"u_sceneNormal");
          if (!bVar4) {
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)p_Var8,"u_scenePosition");
            if (!bVar4) goto LAB_001f9199;
          }
        }
      }
    }
    else {
LAB_001f9199:
      if (((char)p_Var7[5]._M_color == _S_black) && (p_Var7[2]._M_left != (_Base_ptr)0x0)) {
        std::function<void_(vera::Shader_&)>::operator()
                  ((function<void_(vera::Shader_&)> *)(p_Var7 + 2),_shader);
      }
    }
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

bool Uniforms::feedTo(vera::Shader *_shader, bool _lights, bool _buffers ) {
    bool update = false;

    // Pass native uniforms functions (u_time, u_data, etc...)
    for (UniformFunctionsMap::iterator it = functions.begin(); it != functions.end(); ++it) {
        if (!_lights && ( it->first == "u_scene" || it->first == "u_sceneDepth" || it->first == "u_sceneNormal" || it->first == "u_scenePosition") )
            continue;

        if (it->second.present)
            if (it->second.assign)
                it->second.assign( *_shader );
    }

    // Pass user defined uniforms (only if the shader code or scene had changed)
    // if (m_change) 
    {
        for (UniformDataMap::iterator it = data.begin(); it != data.end(); ++it) {
            _shader->setUniform(it->first, it->second.value.data(), it->second.size);
            if (it->second.change) {
                update += true;
            }
        }
    }

    // Pass sequence uniforms (the change every frame)
    for (UniformSequenceMap::iterator it = sequences.begin(); it != sequences.end(); ++it) {
        if (it->second.size() > 0) {
            size_t frame = m_frame % it->second.size();
            _shader->setUniform(it->first, it->second[frame].value.data(), it->second[frame].size);
            update += true;
        }
    }

    // Pass Textures Uniforms
    for (vera::TexturesMap::iterator it = textures.begin(); it != textures.end(); ++it) {
        _shader->setUniformTexture(it->first, it->second, _shader->textureIndex++ );
        _shader->setUniform(it->first+"Resolution", float(it->second->getWidth()), float(it->second->getHeight()));
    }

    for (vera::TextureStreamsMap::iterator it = streams.begin(); it != streams.end(); ++it) {
        for (size_t i = 0; i < it->second->getPrevTexturesTotal(); i++)
            _shader->setUniformTexture(it->first+"Prev["+vera::toString(i)+"]", it->second->getPrevTextureId(i), _shader->textureIndex++);

        _shader->setUniform(it->first+"Time", float(it->second->getTime()));
        _shader->setUniform(it->first+"Fps", float(it->second->getFps()));
        _shader->setUniform(it->first+"Duration", float(it->second->getDuration()));
        _shader->setUniform(it->first+"CurrentFrame", float(it->second->getCurrentFrame()));
        _shader->setUniform(it->first+"TotalFrames", float(it->second->getTotalFrames()));
    }

    // Pass Buffers Texture
    if (_buffers) {
        for (size_t i = 0; i < buffers.size(); i++)
            _shader->setUniformTexture("u_buffer" + vera::toString(i), buffers[i], _shader->textureIndex++ );

        for (size_t i = 0; i < doubleBuffers.size(); i++)
            _shader->setUniformTexture("u_doubleBuffer" + vera::toString(i), doubleBuffers[i]->src, _shader->textureIndex++ );
    
        for (size_t i = 0; i < floods.size(); i++)
            _shader->setUniformTexture("u_flood" + vera::toString(i), floods[i].dst, _shader->textureIndex++ );
    }

    // Pass Convolution Piramids resultant Texture
    for (size_t i = 0; i < pyramids.size(); i++)
        _shader->setUniformTexture("u_pyramid" + vera::toString(i), pyramids[i].getResult(), _shader->textureIndex++ );

    
    if (_lights) {
        // Pass Light Uniforms
        if (lights.size() == 1) {
            vera::LightsMap::iterator it = lights.begin();
            _shader->setUniform("u_lightColor", it->second->color);
            _shader->setUniform("u_lightIntensity", it->second->intensity);
            // if (it->second->getLightType() != vera::LIGHT_DIRECTIONAL)
            _shader->setUniform("u_light", it->second->getPosition());
            if (it->second->getLightType() == vera::LIGHT_DIRECTIONAL || it->second->getLightType() == vera::LIGHT_SPOT)
                _shader->setUniform("u_lightDirection", it->second->direction);
            if (it->second->falloff > 0)
                _shader->setUniform("u_lightFalloff", it->second->falloff);
            _shader->setUniform("u_lightMatrix", it->second->getBiasMVPMatrix() );
            _shader->setUniformDepthTexture("u_lightShadowMap", it->second->getShadowMap(), _shader->textureIndex++ );
        }
        else {
            // TODO:
            //      - Lights should be pass as structs?? 

            for (vera::LightsMap::iterator it = lights.begin(); it != lights.end(); ++it) {
                std::string name = "u_" + it->first;

                _shader->setUniform(name + "Color", it->second->color);
                _shader->setUniform(name + "Intensity", it->second->intensity);
                // if (it->second->getLightType() != vera::LIGHT_DIRECTIONAL)
                _shader->setUniform(name, it->second->getPosition());
                if (it->second->getLightType() == vera::LIGHT_DIRECTIONAL || it->second->getLightType() == vera::LIGHT_SPOT)
                    _shader->setUniform(name + "Direction", it->second->direction);
                if (it->second->falloff > 0)
                    _shader->setUniform(name +"Falloff", it->second->falloff);

                _shader->setUniform(name + "Matrix", it->second->getBiasMVPMatrix() );
                _shader->setUniformDepthTexture(name + "ShadowMap", it->second->getShadowMap(), _shader->textureIndex++ );
            }
        }
        
        if (activeCubemap) {
            _shader->setUniformTextureCube("u_cubeMap", (vera::TextureCube*)activeCubemap);
            _shader->setUniform("u_SH", activeCubemap->SH, 9);
        }
    }
    return update;
}